

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.cpp
# Opt level: O3

byte * __thiscall
slang::BumpAllocator::allocateSlow(BumpAllocator *this,size_t size,size_t alignment)

{
  Segment *pSVar1;
  Segment *pSVar2;
  Segment *pSVar3;
  byte *pbVar4;
  
  if (0x800 < size) {
    pSVar1 = this->head;
    pSVar3 = pSVar1->prev;
    pSVar2 = (Segment *)malloc(((alignment + size) - 1 & -alignment) + 0x10);
    pSVar2->prev = pSVar3;
    pSVar2->current = (byte *)(pSVar2 + 1);
    pSVar1->prev = pSVar2;
    return (byte *)((long)&pSVar2->current + alignment + 7 & -alignment);
  }
  pSVar1 = this->head;
  pSVar3 = (Segment *)malloc(0x1000);
  pSVar3->prev = pSVar1;
  pSVar3->current = (byte *)(pSVar3 + 1);
  this->head = pSVar3;
  this->endPtr = (byte *)(pSVar3 + 0x100);
  pbVar4 = allocate(this,size,alignment);
  return pbVar4;
}

Assistant:

byte* BumpAllocator::allocateSlow(size_t size, size_t alignment) {
    // for really large allocations, give them their own segment
    if (size > (SEGMENT_SIZE >> 1)) {
        size = (size + alignment - 1) & ~(alignment - 1);
        head->prev = allocSegment(head->prev, size + sizeof(Segment));
        return alignPtr(head->prev->current, alignment);
    }

    // otherwise, start a new block
    head = allocSegment(head, SEGMENT_SIZE);
    endPtr = (byte*)head + SEGMENT_SIZE;
    return allocate(size, alignment);
}